

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void doctest::anon_unknown_14::FatalConditionHandler::handleSignal(int sig)

{
  int *piVar1;
  pointer ppIVar2;
  IReporter *pIVar3;
  long lVar4;
  pointer pSVar5;
  ContextState *this;
  pointer ppIVar6;
  IReporter **curr_rep;
  char *__s;
  allocator<char> local_71;
  long *local_70 [2];
  long local_60 [2];
  String local_50;
  undefined1 local_38;
  
  lVar4 = 8;
  __s = "<unknown signal>";
  do {
    if (*(int *)((long)&PTR_typeinfo_name_00164098 + lVar4) == sig) {
      __s = *(char **)((long)&(anonymous_namespace)::signalDefs + lVar4);
      break;
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x68);
  reset();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,__s,&local_71);
  this = detail::g_cs;
  piVar1 = &(detail::g_cs->super_CurrentTestCaseStats).failure_flags;
  *piVar1 = *piVar1 | 4;
  ppIVar6 = (this->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar2 = (this->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar6 != ppIVar2) {
    do {
      pIVar3 = *ppIVar6;
      String::String(&local_50,(char *)local_70[0]);
      local_38 = 1;
      (*pIVar3->_vptr_IReporter[6])(pIVar3,&local_50);
      String::~String(&local_50);
      ppIVar6 = ppIVar6 + 1;
      this = detail::g_cs;
    } while (ppIVar6 != ppIVar2);
  }
  pSVar5 = (this->subcasesStack).
           super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar5 != (this->subcasesStack).
                super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    do {
      (this->subcasesStack).
      super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>.
      _M_impl.super__Vector_impl_data._M_finish = pSVar5 + -1;
      String::~String(&pSVar5[-1].m_name);
      ppIVar2 = (detail::g_cs->reporters_currently_used).
                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      this = detail::g_cs;
      for (ppIVar6 = (detail::g_cs->reporters_currently_used).
                     super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; detail::g_cs = this,
          ppIVar6 != ppIVar2; ppIVar6 = ppIVar6 + 1) {
        (*(*ppIVar6)->_vptr_IReporter[8])();
        this = detail::g_cs;
      }
      pSVar5 = (this->subcasesStack).
               super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (pSVar5 != (this->subcasesStack).
                       super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  detail::ContextState::finalizeTestCaseData(this);
  ppIVar6 = (detail::g_cs->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar2 = (detail::g_cs->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar6 != ppIVar2) {
    do {
      (*(*ppIVar6)->_vptr_IReporter[5])(*ppIVar6,&detail::g_cs->super_CurrentTestCaseStats);
      ppIVar6 = ppIVar6 + 1;
    } while (ppIVar6 != ppIVar2);
    ppIVar2 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar6 = (detail::g_cs->reporters_currently_used).
                   super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppIVar6 != ppIVar2;
        ppIVar6 = ppIVar6 + 1) {
      (*(*ppIVar6)->_vptr_IReporter[2])(*ppIVar6,&detail::g_cs->super_TestRunStats);
    }
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  raise(sig);
  return;
}

Assistant:

static void handleSignal(int sig) {
            const char* name = "<unknown signal>";
            for(std::size_t i = 0; i < DOCTEST_COUNTOF(signalDefs); ++i) {
                SignalDefs& def = signalDefs[i];
                if(sig == def.id) {
                    name = def.name;
                    break;
                }
            }
            reset();
            reportFatal(name);
            raise(sig);
        }